

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable_table.cpp
# Opt level: O1

void __thiscall Variable_table::print_vars(Variable_table *this)

{
  pointer ppVVar1;
  Variable *this_00;
  pointer ppVVar2;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"------ VARIABLES ------","");
  cout_log(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  endl_log();
  ppVVar2 = (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (this->vars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar2 != ppVVar1) {
    do {
      this_00 = *ppVVar2;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"INTEGER ","");
      cout_log(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      Variable::get_name_abi_cxx11_(&local_90,this_00);
      cout_log(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      endl_log();
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 != ppVVar1);
  }
  return;
}

Assistant:

void Variable_table::print_vars()
{
	cout_log("------ VARIABLES ------");
	endl_log();
	for (auto variable : vars) {
		cout_log("INTEGER ");
		cout_log(variable->get_name());
		endl_log();
	}
}